

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::CTransformFeedback::Run<glcts::(anonymous_namespace)::test_api::GL>
          (CTransformFeedback *this)

{
  CallLogWrapper *this_00;
  GLuint *pGVar1;
  GLsizei width;
  uint widthTest;
  uint heightTest;
  uint widthRef;
  GLuint GVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  char *pcVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  runtime_error *prVar8;
  size_type *psVar9;
  long lVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uboData;
  CColorArray coords;
  CElementArray elements;
  CColorArray bufferTest;
  CColorArray bufferRef;
  GLchar *varyings [1];
  DIResult result;
  GLuint zeroes [5];
  allocator_type local_3e9;
  string local_3e8;
  CColorArray local_3c8;
  string local_3b0;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_390;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_378;
  char *local_360;
  undefined1 local_358 [8];
  _func_int **pp_Stack_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348 [23];
  long local_1d8;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined4 local_1b8;
  DILogger local_1a8;
  
  local_3c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::PrimitiveGen(&this->super_DrawIndirectBase,5,8,8,&local_3c8);
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glClear(this_00,0x4000);
  local_348[0]._M_allocated_capacity = 0x6e6f697372657623;
  local_348[0]._8_4_ = 0x30303420;
  pp_Stack_350 = (_func_int **)0xc;
  local_348[0]._M_local_buf[0xc] = '\0';
  local_358 = (undefined1  [8])local_348;
  plVar5 = (long *)std::__cxx11::string::append(local_358);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_3e8.field_2._M_allocated_capacity = *psVar9;
    local_3e8.field_2._8_8_ = plVar5[3];
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  }
  else {
    local_3e8.field_2._M_allocated_capacity = *psVar9;
    local_3e8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_3e8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_358 != (undefined1  [8])local_348) {
    operator_delete((void *)local_358,local_348[0]._M_allocated_capacity + 1);
  }
  local_358 = (undefined1  [8])local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,0x1b3c1e9);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  GVar2 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,&local_3e8,(string *)local_358,&local_3b0,false);
  this->_program = GVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if (local_358 != (undefined1  [8])local_348) {
    operator_delete((void *)local_358,local_348[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  local_360 = "dataOut";
  glu::CallLogWrapper::glTransformFeedbackVaryings(this_00,this->_program,1,&local_360,0x8c8c);
  glu::CallLogWrapper::glLinkProgram(this_00,this->_program);
  lVar6 = DrawIndirectBase::CheckProgram(&this->super_DrawIndirectBase,this->_program);
  if (lVar6 == 0) {
    lVar6 = -1;
  }
  else {
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_vbo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_vbo);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,
               (long)local_3c8.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_3c8.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
               local_3c8.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e4);
    pGVar1 = &this->_ubo;
    glu::CallLogWrapper::glGenBuffers(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8a11,*pGVar1);
    glu::CallLogWrapper::glBufferData(this_00,0x8a11,0x50,(void *)0x0,0x88e4);
    GVar2 = glu::CallLogWrapper::glGetUniformBlockIndex(this_00,this->_program,"BLOCK");
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8a11,GVar2,*pGVar1);
    local_3e8._M_dataplus._M_p = (pointer)0x0;
    local_3e8._M_string_length = 0;
    local_3e8.field_2._M_allocated_capacity = 0;
    if (this->_drawFunc == DRAW_ELEMENTS) {
      local_358 = (undefined1  [8])((ulong)(uint)local_358._4_4_ << 0x20);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3e8,0x14,
                 (value_type_conflict4 *)local_358);
      *(int *)local_3e8._M_dataplus._M_p =
           (int)((ulong)((long)local_3c8.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_3c8.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
      local_3e8._M_dataplus._M_p[0x10] = '\x01';
      local_3e8._M_dataplus._M_p[0x11] = '\0';
      local_3e8._M_dataplus._M_p[0x12] = '\0';
      local_3e8._M_dataplus._M_p[0x13] = '\0';
      local_3e8._M_dataplus._M_p[0x20] = '\0';
      local_3e8._M_dataplus._M_p[0x21] = '\0';
      local_3e8._M_dataplus._M_p[0x22] = '\0';
      local_3e8._M_dataplus._M_p[0x23] = '\0';
      local_3e8._M_dataplus._M_p[0x30] = '\0';
      local_3e8._M_dataplus._M_p[0x31] = '\0';
      local_3e8._M_dataplus._M_p[0x32] = '\0';
      local_3e8._M_dataplus._M_p[0x33] = '\0';
      pcVar7 = local_3e8._M_dataplus._M_p + 0x40;
    }
    else {
      if (this->_drawFunc != DRAW_ARRAYS) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"Unknown draw function!");
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_358 = (undefined1  [8])((ulong)(uint)local_358._4_4_ << 0x20);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3e8,0x10,
                 (value_type_conflict4 *)local_358);
      *(int *)local_3e8._M_dataplus._M_p =
           (int)((ulong)((long)local_3c8.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_3c8.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
      local_3e8._M_dataplus._M_p[0x10] = '\x01';
      local_3e8._M_dataplus._M_p[0x11] = '\0';
      local_3e8._M_dataplus._M_p[0x12] = '\0';
      local_3e8._M_dataplus._M_p[0x13] = '\0';
      local_3e8._M_dataplus._M_p[0x20] = '\0';
      local_3e8._M_dataplus._M_p[0x21] = '\0';
      local_3e8._M_dataplus._M_p[0x22] = '\0';
      local_3e8._M_dataplus._M_p[0x23] = '\0';
      pcVar7 = local_3e8._M_dataplus._M_p + 0x30;
    }
    pcVar7[0] = '\0';
    pcVar7[1] = '\0';
    pcVar7[2] = '\0';
    pcVar7[3] = '\0';
    glu::CallLogWrapper::glBufferSubData
              (this_00,0x8a11,0,local_3e8._M_string_length - (long)local_3e8._M_dataplus._M_p,
               local_3e8._M_dataplus._M_p);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    local_358 = (undefined1  [8])((ulong)local_358 & 0xffffffff00000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3b0,
               (long)local_3c8.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_3c8.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,
               (value_type_conflict4 *)local_358,(allocator_type *)&local_378);
    if (local_3b0._M_string_length - (long)local_3b0._M_dataplus._M_p != 0) {
      lVar6 = (long)(local_3b0._M_string_length - (long)local_3b0._M_dataplus._M_p) >> 2;
      lVar10 = 0;
      do {
        *(int *)(local_3b0._M_dataplus._M_p + lVar10 * 4) = (int)lVar10;
        lVar10 = lVar10 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar10);
    }
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8893,local_3b0._M_string_length - (long)local_3b0._M_dataplus._M_p,
               local_3b0._M_dataplus._M_p,0x88e4);
    pGVar1 = &this->_bufferIndirect;
    glu::CallLogWrapper::glGenBuffers(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,*pGVar1);
    local_1c8 = 0;
    uStack_1c0 = 0;
    local_1b8 = 0;
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,0x14,&local_1c8,0x88e8);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,*pGVar1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,*pGVar1);
    glu::CallLogWrapper::glEnable(this_00,0x8c89);
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
    glu::CallLogWrapper::glDrawArrays(this_00,0,0,5);
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    glu::CallLogWrapper::glDisable(this_00,0x8c89);
    if (this->_drawFunc == DRAW_ARRAYS) {
      glu::CallLogWrapper::glDrawArraysIndirect(this_00,4,(void *)0x0);
    }
    else {
      if (this->_drawFunc != DRAW_ELEMENTS) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"Unknown draw function!");
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x1405,(void *)0x0);
    }
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_358 = (undefined1  [8])0x3e4ccccd3dcccccd;
    pp_Stack_350 = (_func_int **)0x3f8000003e99999a;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_378,(long)(iVar3 * *(int *)(CONCAT44(extraout_var_00,iVar4) + 4)),
               (value_type *)local_358,(allocator_type *)&local_390);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var_01,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_358 = (undefined1  [8])0x0;
    pp_Stack_350 = (_func_int **)0x0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_390,(long)(iVar3 * *(int *)(CONCAT44(extraout_var_02,iVar4) + 4)),
               (value_type *)local_358,&local_3e9);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    width = *(GLsizei *)CONCAT44(extraout_var_03,iVar3);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    glu::CallLogWrapper::glReadPixels
              (this_00,0,0,width,*(GLsizei *)(CONCAT44(extraout_var_04,iVar3) + 4),0x1908,0x1406,
               local_390.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    local_358 = (undefined1  [8])((ulong)local_358 & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_350);
    local_1d8 = 0;
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    widthTest = *(uint *)CONCAT44(extraout_var_05,iVar3);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    heightTest = *(uint *)(CONCAT44(extraout_var_06,iVar3) + 4);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    widthRef = *(uint *)CONCAT44(extraout_var_07,iVar3);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    lVar6 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,&local_390,widthTest,heightTest,&local_378,widthRef,
                       *(uint *)(CONCAT44(extraout_var_08,iVar3) + 4));
    DIResult::sub_result(&local_1a8,(DIResult *)local_358,lVar6);
    DILogger::~DILogger(&local_1a8);
    lVar6 = local_1d8;
    DILogger::~DILogger((DILogger *)local_358);
    if (local_390.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_390.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_390.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_390.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_378.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_378.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_378.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_378.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_3b0._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_3b0._M_dataplus._M_p,
                      local_3b0.field_2._M_allocated_capacity - (long)local_3b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_3e8._M_dataplus._M_p,
                      local_3e8.field_2._M_allocated_capacity - (long)local_3e8._M_dataplus._M_p);
    }
  }
  if (local_3c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c8.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return lVar6;
}

Assistant:

long Run()
	{
		CColorArray coords;
		PrimitiveGen(GL_TRIANGLE_STRIP, 8, 8, coords);

		glClear(GL_COLOR_BUFFER_BIT);

		_program				 = CreateProgram(Vsh<api>(), "", shaders::fshSimple<api>(), false);
		const GLchar* varyings[] = { "dataOut" };
		glTransformFeedbackVaryings(_program, 1, varyings, GL_INTERLEAVED_ATTRIBS);
		glLinkProgram(_program);
		if (!CheckProgram(_program))
		{
			return ERROR;
		}
		glUseProgram(_program);

		glGenBuffers(1, &_vbo);
		glBindBuffer(GL_ARRAY_BUFFER, _vbo);
		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STATIC_DRAW);

		glGenBuffers(1, &_ubo);
		glBindBuffer(GL_UNIFORM_BUFFER, _ubo);
		glBufferData(GL_UNIFORM_BUFFER, 4 * 5 * sizeof(GLuint), NULL, GL_STATIC_DRAW);
		glBindBufferBase(GL_UNIFORM_BUFFER, glGetUniformBlockIndex(_program, "BLOCK"), _ubo);
		std::vector<GLuint> uboData;

		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
		{
			uboData.resize(4 * 4, 0);

			uboData[0]  = static_cast<GLuint>(coords.size()); //count
			uboData[4]  = 1;								  //primcount
			uboData[8]  = 0;								  //first
			uboData[12] = 0;								  //mbz
		}
		break;
		case DRAW_ELEMENTS:
		{
			uboData.resize(4 * 5, 0);
			uboData[0]  = static_cast<GLuint>(coords.size()); //count
			uboData[4]  = 1;								  //primcount
			uboData[8]  = 0;								  //firstindex
			uboData[12] = 0;								  //basevertex
			uboData[16] = 0;								  //mbz
		}
		break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}
		glBufferSubData(GL_UNIFORM_BUFFER, 0, (GLsizeiptr)(uboData.size() * sizeof(uboData[0])), &uboData[0]);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		CElementArray elements(coords.size(), 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		glGenBuffers(1, &_ebo);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
					 GL_STATIC_DRAW);

		glGenBuffers(1, &_bufferIndirect);

		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, _bufferIndirect);
		GLuint zeroes[] = { 0, 0, 0, 0, 0 };
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, sizeof(zeroes), zeroes, GL_DYNAMIC_DRAW);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, _bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);

		glEnable(GL_RASTERIZER_DISCARD);
		glBeginTransformFeedback(GL_POINTS);
		glDrawArrays(GL_POINTS, 0, 5);
		glEndTransformFeedback();
		glDisable(GL_RASTERIZER_DISCARD);

		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
			glDrawArraysIndirect(GL_TRIANGLES, 0);
			break;
		case DRAW_ELEMENTS:
			glDrawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_INT, 0);

			break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}

		CColorArray bufferRef(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.1f, 0.2f, 0.3f, 1.0f));
		CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));
		ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight(), &bufferTest[0]);

		DIResult result;
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight(), bufferRef, getWindowWidth(),
										 getWindowHeight()));

		return result.code();
	}